

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

int Cba_NtkCheckComboLoop(Cba_Ntk_t *p)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  int nSize;
  
  uVar2 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar2) {
    piVar4 = (p->vObjCopy).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar2 << 2);
    }
    (p->vObjCopy).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vObjCopy).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar2 * 4);
  }
  (p->vObjCopy).nSize = uVar2;
  if (1 < (p->vObjType).nSize) {
    lVar5 = 1;
    nSize = 2;
    do {
      if ((p->vObjType).nSize <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar1 = (p->vObjType).pArray[lVar5];
      if (0xffffffa8 < bVar1 - 0x5a) {
        if (bVar1 == 3) {
          if ((p->vObjFunc).nSize < 1) {
            uVar2 = 0;
          }
          else {
            Vec_IntFillExtra(&p->vObjFunc,nSize,0);
            if ((p->vObjFunc).nSize <= lVar5) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar2 = (p->vObjFunc).pArray[lVar5];
          }
          uVar2 = *(uint *)((long)(p->pDesign->vNtks).pArray[uVar2] + 0x14) >> 2 & 1;
        }
        else {
          uVar2 = (uint)(bVar1 - 0x4c < 0xc);
        }
        if ((uVar2 == 0) && (iVar3 = Cba_NtkCheckComboLoop_rec(p,nSize + -1), iVar3 == 0)) {
          puts("Cyclic dependency of user boxes is detected.");
          return 0;
        }
      }
      lVar5 = lVar5 + 1;
      nSize = nSize + 1;
    } while (lVar5 < (p->vObjType).nSize);
  }
  return 1;
}

Assistant:

int Cba_NtkCheckComboLoop( Cba_Ntk_t * p )
{
    int iObj;
    Cba_NtkCleanObjCopies( p ); // -1 = not visited; 0 = on the path; 1 = finished
    Cba_NtkForEachBox( p, iObj )
        if ( !Cba_ObjIsSeq(p, iObj) )
            if ( !Cba_NtkCheckComboLoop_rec( p, iObj ) )
            {
                printf( "Cyclic dependency of user boxes is detected.\n" );
                return 0;
            }
    return 1;
}